

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ClosePopupToLevel(int remaining)

{
  int *piVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow **ppIVar3;
  ImGuiPopupRef *__dest;
  ImGuiContext *pIVar4;
  int iVar5;
  ImGuiPopupRef *pIVar6;
  
  pIVar2 = GImGui;
  iVar5 = (GImGui->OpenPopupStack).Size;
  if (remaining < 1) {
    if (iVar5 < 1) goto LAB_0013667d;
    ppIVar3 = &((GImGui->OpenPopupStack).Data)->ParentWindow;
  }
  else {
    if (iVar5 < remaining) {
LAB_0013667d:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x353,
                    "value_type &ImVector<ImGuiPopupRef>::operator[](int) [T = ImGuiPopupRef]");
    }
    ppIVar3 = &(GImGui->OpenPopupStack).Data[(ulong)(uint)remaining - 1].Window;
  }
  ImGui::FocusWindow(*ppIVar3);
  pIVar4 = GImGui;
  iVar5 = (pIVar2->OpenPopupStack).Capacity;
  if (remaining <= iVar5) goto LAB_0013666b;
  if (iVar5 == 0) {
    iVar5 = 8;
  }
  else {
    iVar5 = iVar5 / 2 + iVar5;
  }
  if (iVar5 <= remaining) {
    iVar5 = remaining;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (ImGuiPopupRef *)(*(pIVar4->IO).MemAllocFn)((long)iVar5 * 0x28);
  pIVar6 = (pIVar2->OpenPopupStack).Data;
  if (pIVar6 == (ImGuiPopupRef *)0x0) {
LAB_00136655:
    pIVar6 = (ImGuiPopupRef *)0x0;
    pIVar4 = GImGui;
  }
  else {
    memcpy(__dest,pIVar6,(long)(pIVar2->OpenPopupStack).Size * 0x28);
    pIVar4 = GImGui;
    pIVar6 = (pIVar2->OpenPopupStack).Data;
    if (pIVar6 == (ImGuiPopupRef *)0x0) goto LAB_00136655;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar4->IO).MemFreeFn)(pIVar6);
  (pIVar2->OpenPopupStack).Data = __dest;
  (pIVar2->OpenPopupStack).Capacity = iVar5;
LAB_0013666b:
  (pIVar2->OpenPopupStack).Size = remaining;
  return;
}

Assistant:

static void ClosePopupToLevel(int remaining)
{
    ImGuiContext& g = *GImGui;
    if (remaining > 0)
        ImGui::FocusWindow(g.OpenPopupStack[remaining-1].Window);
    else
        ImGui::FocusWindow(g.OpenPopupStack[0].ParentWindow);
    g.OpenPopupStack.resize(remaining);
}